

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCover.c
# Opt level: O2

Mvc_Cover_t * Mvc_CoverClone(Mvc_Cover_t *p)

{
  int iVar1;
  Mvc_Cover_t *pMVar2;
  
  pMVar2 = (Mvc_Cover_t *)Extra_MmFixedEntryFetch(p->pMem->pManC);
  pMVar2->pMem = p->pMem;
  pMVar2->nBits = p->nBits;
  iVar1 = p->nUnused;
  pMVar2->nWords = p->nWords;
  pMVar2->nUnused = iVar1;
  pMVar2->nCubesAlloc = 0;
  pMVar2->pCubes = (Mvc_Cube_t **)0x0;
  (pMVar2->lCubes).nItems = 0;
  (pMVar2->lCubes).pHead = (Mvc_Cube_t *)0x0;
  (pMVar2->lCubes).pTail = (Mvc_Cube_t *)0x0;
  pMVar2->pLits = (int *)0x0;
  pMVar2->pMask = (Mvc_Cube_t *)0x0;
  return pMVar2;
}

Assistant:

Mvc_Cover_t * Mvc_CoverClone( Mvc_Cover_t * p )
{
    Mvc_Cover_t * pCover;
#ifdef USE_SYSTEM_MEMORY_MANAGEMENT
    pCover                = (Mvc_Cover_t *)ABC_ALLOC( char, sizeof(Mvc_Cover_t) );
#else
    pCover                = (Mvc_Cover_t *)Extra_MmFixedEntryFetch( p->pMem->pManC );
#endif
    pCover->pMem          = p->pMem;
    pCover->nBits         = p->nBits;
    pCover->nWords        = p->nWords;
    pCover->nUnused       = p->nUnused;
    pCover->lCubes.nItems = 0;
    pCover->lCubes.pHead  = NULL;
    pCover->lCubes.pTail  = NULL;
    pCover->nCubesAlloc   = 0;
    pCover->pCubes        = NULL;
    pCover->pMask         = NULL;
    pCover->pLits         = NULL;
    return pCover;
}